

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

pool_ptr<soul::AST::Namespace> __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::findParameterisedNamespace
          (QualifiedIdentifierResolver *this,QualifiedIdentifier *qi,int *itemsRemoved)

{
  bool bVar1;
  Scope *this_00;
  Statement *statementToSearchUpTo;
  size_t sVar2;
  pool_ref<soul::AST::ASTObject> *ppVar3;
  Namespace *this_01;
  undefined4 *in_RCX;
  IdentifierPath local_248;
  int local_1ec;
  pool_ref<soul::AST::ASTObject> local_1e8;
  pool_ptr<soul::AST::Namespace> local_1e0;
  pool_ptr<soul::AST::Namespace> n;
  pool_ref<soul::AST::ASTObject> item;
  Scope *scope;
  NameSearch search;
  string p;
  IdentifierPath local_d8;
  undefined1 local_80 [8];
  IdentifierPath path;
  int *itemsRemoved_local;
  QualifiedIdentifier *qi_local;
  QualifiedIdentifierResolver *this_local;
  
  *in_RCX = 1;
  path.pathSections.space[7] = (uint64_t)in_RCX;
  AST::QualifiedIdentifier::getPath(&local_d8,(QualifiedIdentifier *)itemsRemoved);
  IdentifierPath::getParentPath((IdentifierPath *)local_80,&local_d8);
  IdentifierPath::~IdentifierPath(&local_d8);
  IdentifierPath::toString_abi_cxx11_((string *)&search.findVariables,(IdentifierPath *)local_80);
  do {
    bVar1 = IdentifierPath::empty((IdentifierPath *)local_80);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pool_ptr<soul::AST::Namespace>::pool_ptr((pool_ptr<soul::AST::Namespace> *)this);
      local_1ec = 1;
      break;
    }
    AST::Scope::NameSearch::NameSearch((NameSearch *)&scope);
    IdentifierPath::operator=
              ((IdentifierPath *)(search.itemsFound.space + 7),(IdentifierPath *)local_80);
    search.partiallyQualifiedPath.pathSections.space[7]._0_1_ = 1;
    search.stopAtFirstScopeWithResults = false;
    search._177_1_ = 0;
    search._178_1_ = 0;
    search._179_1_ = 1;
    search.requiredNumFunctionArgs._0_1_ = 0;
    search.requiredNumFunctionArgs._1_1_ = 0;
    search.requiredNumFunctionArgs._2_1_ = 0;
    this_00 = AST::ASTObject::getParentScope((ASTObject *)itemsRemoved);
    if (this_00 != (Scope *)0x0) {
      statementToSearchUpTo =
           pool_ptr<soul::AST::Statement>::get
                     ((pool_ptr<soul::AST::Statement> *)
                      &(qi->pathSections).
                       super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      AST::Scope::performFullNameSearch(this_00,(NameSearch *)&scope,statementToSearchUpTo);
    }
    sVar2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::size
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)&scope);
    if (sVar2 == 0) {
LAB_003ad5c4:
      IdentifierPath::getParentPath(&local_248,(IdentifierPath *)local_80);
      IdentifierPath::operator=((IdentifierPath *)local_80,&local_248);
      IdentifierPath::~IdentifierPath(&local_248);
      *(int *)path.pathSections.space[7] = *(int *)path.pathSections.space[7] + 1;
      local_1ec = 0;
    }
    else {
      ppVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                         ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                          &scope);
      local_1e8.object = ppVar3->object;
      n.object = (Namespace *)local_1e8.object;
      cast<soul::AST::Namespace,soul::AST::ASTObject>((soul *)&local_1e0,&local_1e8);
      pool_ref<soul::AST::ASTObject>::~pool_ref(&local_1e8);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_1e0);
      if (bVar1) {
        this_01 = pool_ptr<soul::AST::Namespace>::operator->(&local_1e0);
        bVar1 = AST::ModuleBase::isTemplateModule(&this_01->super_ModuleBase);
        if (bVar1) {
          (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
          super_RewritingASTVisitor._vptr_RewritingASTVisitor = (_func_int **)local_1e0.object;
          local_1ec = 1;
        }
        else {
          pool_ptr<soul::AST::Namespace>::pool_ptr((pool_ptr<soul::AST::Namespace> *)this);
          local_1ec = 1;
        }
      }
      else {
        local_1ec = 0;
      }
      pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_1e0);
      if (local_1ec == 0) {
        local_1ec = 0;
      }
      pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&n);
      if (local_1ec == 0) goto LAB_003ad5c4;
    }
    AST::Scope::NameSearch::~NameSearch((NameSearch *)&scope);
  } while (local_1ec == 0);
  std::__cxx11::string::~string((string *)&search.findVariables);
  IdentifierPath::~IdentifierPath((IdentifierPath *)local_80);
  return (pool_ptr<soul::AST::Namespace>)(Namespace *)this;
}

Assistant:

pool_ptr<AST::Namespace> findParameterisedNamespace (AST::QualifiedIdentifier& qi, int& itemsRemoved)
        {
            itemsRemoved = 1;
            auto path = qi.getPath().getParentPath();
            auto p = path.toString();

            while (! path.empty())
            {
                AST::Scope::NameSearch search;
                search.partiallyQualifiedPath = path;
                search.stopAtFirstScopeWithResults = true;
                search.findVariables = false;
                search.findTypes = false;
                search.findFunctions = false;
                search.findNamespaces = true;
                search.findProcessors = false;
                search.findProcessorInstances = false;
                search.findEndpoints = false;

                if (auto scope = qi.getParentScope())
                    scope->performFullNameSearch (search, currentStatement.get());

                if (search.itemsFound.size() != 0)
                {
                    auto item = search.itemsFound.front();

                    if (auto n = cast<AST::Namespace> (item))
                    {
                        if (n->isTemplateModule())
                            return n;

                        return {};
                    }
                }

                path = path.getParentPath();
                itemsRemoved++;
            }

            return {};
        }